

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_dio.cc
# Opt level: O2

bool __thiscall
sptk::PitchExtractionByDio::Get
          (PitchExtractionByDio *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  double *x;
  pointer pdVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  double dVar7;
  undefined1 auVar8 [16];
  vector<double,_std::allocator<double>_> tmp_f0;
  vector<double,_std::allocator<double>_> time_axis;
  allocator_type local_99;
  _Vector_base<double,_std::allocator<double>_> local_98;
  _Vector_base<double,_std::allocator<double>_> local_80;
  DioOption local_68;
  
  if ((this->is_valid_ == true) &&
     ((waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar6 = true;
    if (f0 != (vector<double,_std::allocator<double>_> *)0x0) {
      world::InitializeDioOption(&local_68);
      local_68.frame_period = ((double)this->frame_shift_ * 1000.0) / this->sampling_rate_;
      local_68.f0_floor = this->lower_f0_;
      local_68.f0_ceil = this->upper_f0_;
      local_68.allowed_range = this->voicing_threshold_;
      iVar2 = world::GetSamplesForDIO
                        ((int)this->sampling_rate_,
                         (int)((ulong)((long)(waveform->
                                             super__Vector_base<double,_std::allocator<double>_>).
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)(waveform->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data._M_start) >> 3),
                         local_68.frame_period);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_80,(long)iVar2,
                 (allocator_type *)&local_98);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_98,(long)iVar2,&local_99);
      x = (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start;
      world::Dio(x,(int)((ulong)((long)(waveform->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_finish - (long)x) >> 3),
                 (int)this->sampling_rate_,&local_68,
                 local_80._M_impl.super__Vector_impl_data._M_start,
                 local_98._M_impl.super__Vector_impl_data._M_start);
      lVar4 = (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      lVar5 = lVar4 >> 3;
      auVar8._8_4_ = (int)(lVar4 >> 0x23);
      auVar8._0_8_ = lVar5;
      auVar8._12_4_ = 0x45300000;
      dVar7 = ceil(((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
                   (double)this->frame_shift_);
      iVar3 = (int)dVar7;
      if (iVar3 < iVar2) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)&local_98,(long)iVar3);
      }
      std::vector<double,_std::allocator<double>_>::resize(f0,(long)iVar3);
      if ((long)local_98._M_impl.super__Vector_impl_data._M_finish -
          (long)local_98._M_impl.super__Vector_impl_data._M_start != 0) {
        memmove((f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,local_98._M_impl.super__Vector_impl_data._M_start,
                (long)local_98._M_impl.super__Vector_impl_data._M_finish -
                (long)local_98._M_impl.super__Vector_impl_data._M_start);
      }
      pdVar1 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      dVar7 = local_98._M_impl.super__Vector_impl_data._M_finish[-1];
      for (local_98._M_impl.super__Vector_impl_data._M_finish =
                (pointer)((long)local_98._M_impl.super__Vector_impl_data._M_finish +
                         ((long)(f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start -
                         (long)local_98._M_impl.super__Vector_impl_data._M_start));
          local_98._M_impl.super__Vector_impl_data._M_finish != pdVar1;
          local_98._M_impl.super__Vector_impl_data._M_finish =
               local_98._M_impl.super__Vector_impl_data._M_finish + 1) {
        *local_98._M_impl.super__Vector_impl_data._M_finish = dVar7;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_98);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_80);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool PitchExtractionByDio::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  if (NULL != f0) {
    world::DioOption option;
    world::InitializeDioOption(&option);

    const double frame_period((1000.0 * frame_shift_) / sampling_rate_);
    option.frame_period = frame_period;
    option.f0_floor = lower_f0_;
    option.f0_ceil = upper_f0_;
    option.allowed_range = voicing_threshold_;

    const int tmp_length(world::GetSamplesForDIO(
        static_cast<int>(sampling_rate_), static_cast<int>(waveform.size()),
        frame_period));
    std::vector<double> time_axis(tmp_length);
    std::vector<double> tmp_f0(tmp_length);
    world::Dio(waveform.data(), static_cast<int>(waveform.size()),
               static_cast<int>(sampling_rate_), &option, time_axis.data(),
               tmp_f0.data());

    const int target_length(static_cast<int>(
        std::ceil(static_cast<double>(waveform.size()) / frame_shift_)));
    if (target_length < tmp_length) {
      tmp_f0.resize(target_length);
    }
    f0->resize(target_length);
    std::copy(tmp_f0.begin(), tmp_f0.end(), f0->begin());
    std::fill(f0->begin() + tmp_f0.size(), f0->end(), tmp_f0.back());
  }

  if (NULL != epochs) {
    // nothing to do
  }

  if (NULL != polarity) {
    // nothing to do
  }

  return true;
}